

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-log.cpp
# Opt level: O0

int main(void)

{
  thread *ptVar1;
  int i_1;
  int i;
  thread threads [8];
  int n_thread;
  thread *in_stack_ffffffffffffff48;
  thread *in_stack_ffffffffffffff50;
  thread *local_a0;
  thread *this;
  thread *local_78;
  int local_70;
  int local_4c;
  thread local_48 [8];
  thread local_8;
  
  local_8._M_id._M_thread._4_4_ = 0;
  local_8._M_id._M_thread._0_4_ = 8;
  this = &local_8;
  ptVar1 = local_48;
  do {
    local_78 = ptVar1;
    std::thread::thread((thread *)0x1054e2);
    ptVar1 = local_78 + 1;
  } while (local_78 + 1 != this);
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    std::thread::thread<main::__0,,void>(this,(type *)local_78);
    std::thread::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::thread::~thread((thread *)0x105547);
  }
  for (local_70 = 0; local_70 < 8; local_70 = local_70 + 1) {
    std::thread::join();
  }
  local_8._M_id._M_thread._4_4_ = 0;
  local_a0 = &local_8;
  do {
    local_a0 = local_a0 + -1;
    std::thread::~thread((thread *)0x1055da);
  } while (local_a0 != local_48);
  return local_8._M_id._M_thread._4_4_;
}

Assistant:

int main() {
    const int n_thread = 8;

    std::thread threads[n_thread];
    for (int i = 0; i < n_thread; i++) {
        threads[i] = std::thread([i]() {
            const int n_msg = 1000;

            for (int j = 0; j < n_msg; j++) {
                const int log_type = std::rand() % 4;

                switch (log_type) {
                    case 0: LOG_INF("Thread %d: %d\n", i, j); break;
                    case 1: LOG_WRN("Thread %d: %d\n", i, j); break;
                    case 2: LOG_ERR("Thread %d: %d\n", i, j); break;
                    case 3: LOG_DBG("Thread %d: %d\n", i, j); break;
                    default:
                        break;
                }

                if (rand () % 10 < 5) {
                    common_log_set_timestamps(common_log_main(), rand() % 2);
                    common_log_set_prefix    (common_log_main(), rand() % 2);
                }
            }
        });
    }

    for (int i = 0; i < n_thread; i++) {
        threads[i].join();
    }

    return 0;
}